

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O0

void __thiscall
IOStreamBufferTest_creationTest_Test::TestBody(IOStreamBufferTest_creationTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  undefined1 local_68 [8];
  IOStreamBuffer<char> myBuffer;
  bool ok;
  IOStreamBufferTest_creationTest_Test *this_local;
  
  myBuffer.m_filePos._7_1_ = 1;
  Assimp::IOStreamBuffer<char>::IOStreamBuffer((IOStreamBuffer<char> *)local_68,0x1000000);
  Assimp::IOStreamBuffer<char>::~IOStreamBuffer((IOStreamBuffer<char> *)local_68);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_88,(bool *)((long)&myBuffer.m_filePos + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_88,(AssertionResult *)0xc77c0f,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOStreamBuffer.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, creationTest ) {
    bool ok( true );
    try {
        IOStreamBuffer<char> myBuffer;
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}